

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void random_colors(Model *model,TGAImage *image)

{
  array<vec<3UL,_int>,_3UL> pts_00;
  int iVar1;
  int iVar2;
  pointer pdVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  int j;
  size_t i;
  ulong iface;
  int *piVar7;
  vector<double,_std::allocator<double>_> zbuffer;
  array<vec<3UL,_int>,_3UL> pts;
  vector<double,_std::allocator<double>_> local_98;
  TGAImage *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  vec3f local_48;
  
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_80 = image;
  pdVar3 = (pointer)operator_new(0x2bf200);
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar3 + 360000;
  lVar5 = 0;
  do {
    *(undefined8 *)((long)pdVar3 + lVar5) = 0xffefffffffffffff;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x2bf200);
  iface = 0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar3;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  while( true ) {
    sVar4 = Model::nfaces(model);
    if (sVar4 <= iface) break;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_58 = 0;
    piVar7 = (int *)&uStack_70;
    sVar4 = 0;
    do {
      Model::vert(&local_48,model,iface,sVar4);
      iVar6 = (int)local_48.z;
      *(ulong *)(piVar7 + -2) =
           CONCAT44((int)((local_48.y + 1.0) * 600.0 * 0.5 + 0.5),
                    (int)((local_48.x + 1.0) * 600.0 * 0.5 + 0.5));
      *piVar7 = iVar6;
      sVar4 = sVar4 + 1;
      piVar7 = piVar7 + 3;
    } while (sVar4 != 3);
    iVar6 = rand();
    iVar1 = rand();
    iVar2 = rand();
    pts_00._M_elems[0].z = (undefined4)uStack_70;
    pts_00._M_elems[1].x = uStack_70._4_4_;
    pts_00._M_elems[0].x = (undefined4)local_78;
    pts_00._M_elems[0].y = local_78._4_4_;
    pts_00._M_elems[1].y = (undefined4)local_68;
    pts_00._M_elems[1].z = local_68._4_4_;
    pts_00._M_elems[2].x = (undefined4)uStack_60;
    pts_00._M_elems[2].y = uStack_60._4_4_;
    pts_00._M_elems[2].z = local_58;
    triangle(pts_00,&local_98,local_80,
             (TGAColor)
             ((uint5)(((uint)((ulong)((long)iVar2 * 0x80808081) >> 0x27) - (iVar2 >> 0x1f)) + iVar2
                      & 0xff | (((uint)((ulong)((long)iVar1 * 0x80808081) >> 0x27) - (iVar1 >> 0x1f)
                                ) + iVar1 & 0xff) << 8 | (iVar6 % 0xff) * 0x10000) | 0x4ff000000));
    iface = iface + 1;
  }
  operator_delete(pdVar3,0x2bf200);
  return;
}

Assistant:

void random_colors(Model &model, TGAImage &image)
{
    vec3f light_dir{0, 0, -1};
    std::vector<double> zbuffer(width * height, -std::numeric_limits<double>::max());
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec3i, 3> pts;
        for (int j = 0; j < 3; j++) pts[j] = world2screen(model.vert(i, j));
        triangle(pts, zbuffer, image, TGAColor(rand() % 255, rand() % 255, rand() % 255, 255));
    }
}